

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_enable_load_extension(sqlite3 *db,int onoff)

{
  int in_ESI;
  long in_RDI;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x145cef);
  if (in_ESI == 0) {
    *(ulong *)(in_RDI + 0x30) = *(ulong *)(in_RDI + 0x30) & 0xfffffffffffcffff;
  }
  else {
    *(ulong *)(in_RDI + 0x30) = *(ulong *)(in_RDI + 0x30) | 0x30000;
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x145d2e);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_enable_load_extension(sqlite3 *db, int onoff){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  if( onoff ){
    db->flags |= SQLITE_LoadExtension|SQLITE_LoadExtFunc;
  }else{
    db->flags &= ~(u64)(SQLITE_LoadExtension|SQLITE_LoadExtFunc);
  }
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}